

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean set_quality_ratings(j_compress_ptr cinfo,char *arg,boolean force_baseline)

{
  char cVar1;
  boolean force_baseline_00;
  j_compress_ptr cinfo_00;
  int iVar2;
  long lVar3;
  char ch;
  int val;
  char local_41;
  int local_40;
  boolean local_3c;
  j_compress_ptr local_38;
  
  local_40 = 0x4b;
  lVar3 = 0;
  local_3c = force_baseline;
  local_38 = cinfo;
  do {
    if (*arg == '\0') {
      iVar2 = jpeg_quality_scaling(local_40);
      q_scale_factor[lVar3] = iVar2;
    }
    else {
      local_41 = ',';
      iVar2 = __isoc99_sscanf(arg,"%d%c",&local_40,&local_41);
      if (iVar2 < 1) {
        return 0;
      }
      if (local_41 != ',') {
        return 0;
      }
      iVar2 = jpeg_quality_scaling(local_40);
      q_scale_factor[lVar3] = iVar2;
      do {
        cVar1 = *arg;
        if (cVar1 == '\0') break;
        arg = arg + 1;
      } while (cVar1 != ',');
    }
    cinfo_00 = local_38;
    force_baseline_00 = local_3c;
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      jpeg_add_quant_table(local_38,0,std_luminance_quant_tbl,q_scale_factor[0],local_3c);
      jpeg_add_quant_table(cinfo_00,1,std_chrominance_quant_tbl,q_scale_factor[1],force_baseline_00)
      ;
      return 1;
    }
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_quality_ratings(j_compress_ptr cinfo, char *arg, boolean force_baseline)
/* Process a quality-ratings parameter string, of the form
 *     N[,N,...]
 * If there are more q-table slots than parameters, the last value is replicated.
 */
{
  int val = 75;                 /* default value */
  int tblno;
  char ch;

  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (*arg) {
      ch = ',';                 /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c", &val, &ch) < 1)
        return FALSE;
      if (ch != ',')            /* syntax check */
        return FALSE;
      /* Convert user 0-100 rating to percentage scaling */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
      while (*arg && *arg++ != ','); /* advance to next segment of arg
                                        string */
    } else {
      /* reached end of parameter, set remaining factors to last value */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
    }
  }
  jpeg_default_qtables(cinfo, force_baseline);
  return TRUE;
}